

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test::testBody
          (TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_130 [48];
  SimpleString local_100;
  SimpleString local_f0 [2];
  SimpleString local_d0;
  undefined1 local_c0 [8];
  MockCheckedExpectedCall expectedCall;
  uchar buffer_value [3];
  uint uint_value;
  int int_value;
  TEST_MockExpectedCall_toStringForMultipleInputAndOutputParameters_Test *this_local;
  
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)local_c0,1);
  SimpleString::SimpleString(&local_d0,"name");
  MockCheckedExpectedCall::withName((MockCheckedExpectedCall *)local_c0,&local_d0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(local_f0,"string");
  MockExpectedCall::withParameter((MockExpectedCall *)local_c0,local_f0,"value");
  SimpleString::~SimpleString(local_f0);
  SimpleString::SimpleString(&local_100,"integer");
  MockExpectedCall::withParameter((MockExpectedCall *)local_c0,&local_100,10);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString((SimpleString *)(local_130 + 0x20),"unsigned-integer");
  MockExpectedCall::withParameter((MockExpectedCall *)local_c0,(SimpleString *)(local_130 + 0x20),7)
  ;
  SimpleString::~SimpleString((SimpleString *)(local_130 + 0x20));
  SimpleString::SimpleString((SimpleString *)(local_130 + 0x10),"buffer");
  MockCheckedExpectedCall::withOutputParameterReturning
            ((MockCheckedExpectedCall *)local_c0,(SimpleString *)(local_130 + 0x10),
             &expectedCall.field_0x9d,3);
  SimpleString::~SimpleString((SimpleString *)(local_130 + 0x10));
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)local_c0,1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_130);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_130);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)>, const void* buffer: <output> (expected 1 call, called 1 time)"
             ,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x25b,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_130);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)local_c0);
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForMultipleInputAndOutputParameters)
{
    int int_value = 10;
    unsigned int uint_value = 7;
    unsigned char buffer_value[3];

    MockCheckedExpectedCall expectedCall(1);
    expectedCall.withName("name");
    expectedCall.withParameter("string", "value");
    expectedCall.withParameter("integer", int_value);
    expectedCall.withParameter("unsigned-integer", uint_value);
    expectedCall.withOutputParameterReturning("buffer", buffer_value, sizeof(buffer_value));
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> const char* string: <value>, int integer: <10 (0xa)>, unsigned int unsigned-integer: <7 (0x7)>, "
                 "const void* buffer: <output> (expected 1 call, called 1 time)", expectedCall.callToString().asCharString());
}